

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.hpp
# Opt level: O2

void ovf::detail::endian::to_little_64(uint64_t *in,uint8_t *bytes)

{
  *bytes = (uint8_t)*in;
  bytes[1] = *(uint8_t *)((long)in + 1);
  bytes[2] = *(uint8_t *)((long)in + 2);
  bytes[3] = *(uint8_t *)((long)in + 3);
  bytes[4] = *(uint8_t *)((long)in + 4);
  bytes[5] = *(uint8_t *)((long)in + 5);
  bytes[6] = *(uint8_t *)((long)in + 6);
  bytes[7] = *(uint8_t *)((long)in + 7);
  return;
}

Assistant:

inline void to_little_64(const uint64_t & in, uint8_t * bytes)
    {
        bytes[0] = in >> 0;
        bytes[1] = in >> 8;
        bytes[2] = in >> 16;
        bytes[3] = in >> 24;
        bytes[4] = in >> 32;
        bytes[5] = in >> 40;
        bytes[6] = in >> 48;
        bytes[7] = in >> 56;
    }